

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_poly(rf_vec2 center,int sides,float radius,float rotation,rf_color color)

{
  _Bool _Var1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  undefined4 local_40;
  undefined4 local_38;
  undefined4 uStack_34;
  
  uVar3 = 3;
  if (3 < sides) {
    uVar3 = (ulong)(uint)sides;
  }
  _Var1 = rf_gfx_check_buffer_limit((int)(0x168 / uVar3) * 4);
  if (_Var1) {
    rf_gfx_draw();
  }
  rf_gfx_push_matrix();
  local_38 = center.x;
  uStack_34 = center.y;
  local_40 = 0.0;
  rf_gfx_translatef(local_38,uStack_34,0.0);
  rf_gfx_rotatef(rotation,0.0,0.0,1.0);
  rf_gfx_begin(RF_TRIANGLES);
  iVar2 = (int)uVar3;
  while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
    rf_gfx_color4ub(color.r,color.g,color.b,color.a);
    rf_gfx_vertex2f(0.0,0.0);
    fVar5 = sinf(local_40 * 0.017453292);
    fVar6 = cosf(local_40 * 0.017453292);
    rf_gfx_vertex2f(fVar5 * radius,fVar6 * radius);
    local_40 = local_40 + 360.0 / (float)iVar2;
    fVar5 = sinf(local_40 * 0.017453292);
    fVar6 = cosf(local_40 * 0.017453292);
    rf_gfx_vertex2f(fVar5 * radius,fVar6 * radius);
  }
  rf_gfx_end();
  rf_gfx_pop_matrix();
  return;
}

Assistant:

RF_API void rf_draw_poly(rf_vec2 center, int sides, float radius, float rotation, rf_color color)
{
    if (sides < 3) sides = 3;
    float centralAngle = 0.0f;

    if (rf_gfx_check_buffer_limit(4 * (360/sides))) rf_gfx_draw();

    rf_gfx_push_matrix();
    rf_gfx_translatef(center.x, center.y, 0.0f);
    rf_gfx_rotatef(rotation, 0.0f, 0.0f, 1.0f);
    rf_gfx_begin(RF_TRIANGLES);
    for (rf_int i = 0; i < sides; i++)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);

        rf_gfx_vertex2f(0, 0);
        rf_gfx_vertex2f(sinf(RF_DEG2RAD*centralAngle)*radius, cosf(RF_DEG2RAD*centralAngle)*radius);

        centralAngle += 360.0f/(float)sides;
        rf_gfx_vertex2f(sinf(RF_DEG2RAD*centralAngle)*radius, cosf(RF_DEG2RAD*centralAngle)*radius);
    }
    rf_gfx_end();

    rf_gfx_pop_matrix();
}